

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall Expr_i_Test::TestBody(Expr_i_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  ExprPtr EVar4;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  complex<double> result;
  Message local_68 [3];
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ExprPtr expr;
  Expr_i_Test *this_local;
  
  EVar4 = mathiu::impl::operator*
                    ((impl *)&gtest_ar.message_,(ExprPtr *)mathiu::impl::i,
                     (ExprPtr *)mathiu::impl::i);
  mathiu::impl::toString_abi_cxx11_
            (&local_50,(impl *)&gtest_ar.message_,
             (ExprPtr *)
             EVar4.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_30,"toString(expr)","\"(^ i 2)\"",&local_50,(char (*) [8])"(^ i 2)");
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(result._M_value + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(result._M_value + 8),local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(result._M_value + 8));
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  mathiu::impl::evalc((ExprPtr *)&gtest_ar.message_);
  dVar3 = std::complex<double>::real_abi_cxx11_((complex<double> *)&gtest_ar_1.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,"result.real()","-1","1e-5",dVar3,-1.0,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  dVar3 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&gtest_ar_1.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b0,"result.imag()","0","1e-5",dVar3,0.0,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Expr, i)
{
    auto expr = i * i;
    EXPECT_EQ(toString(expr), "(^ i 2)");
    auto result = evalc(expr);
    EXPECT_NEAR(result.real(), -1, 1e-5);
    EXPECT_NEAR(result.imag(), 0, 1e-5);
}